

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int writesettings(char *name)

{
  int __fd;
  size_t sVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char buf [13];
  char fname [41];
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  if (canfd_mode == 1) {
    builtin_strncpy(fname + 8,"_fd.",5);
  }
  else {
    if (canfd_mode != 0) {
      puts("writesettings failed due to unspecified CAN FD mode");
      return 1;
    }
    fname[8] = '.';
    fname[9] = '\0';
  }
  builtin_strncpy(fname,"sniffset",8);
  sVar1 = strlen(fname);
  strncat(fname,name,0x28 - sVar1);
  __fd = open(fname,0x41,0x1a4);
  if (__fd < 1) {
    printf("unable to write setting file \'%s\'!\n",fname);
  }
  else {
    lVar6 = 0x106298;
    lVar5 = 0;
    while( true ) {
      if (idx <= lVar5) {
        close(__fd);
        return 0;
      }
      sprintf(buf,"<%08X>%c.",(ulong)sniftab[lVar5].current.can_id,
              (ulong)(sniftab[lVar5].flags & 1U | 0x30));
      sVar2 = write(__fd,buf,0xc);
      if (sVar2 < 0) break;
      uVar4 = 0;
      while( true ) {
        uVar3 = 8;
        if (max_dlen != '\0') {
          uVar3 = 0x40;
        }
        if (uVar3 <= uVar4) break;
        sprintf(buf,"%02X",(ulong)*(byte *)(lVar6 + uVar4));
        sVar2 = write(__fd,buf,2);
        uVar4 = uVar4 + 1;
        if (sVar2 < 0) goto LAB_00102658;
      }
      sVar2 = write(__fd,"\n",1);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x158;
      if (sVar2 < 0) break;
    }
LAB_00102658:
    perror("write");
  }
  return 1;
}

Assistant:

int writesettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	int i,j;
	char buf[13]= {0};

	if (canfd_mode == CANFD_OFF)
		strcpy(fname, SETFNAME);
	else if (canfd_mode == CANFD_ON)
		strcpy(fname, SETFDFNAME);
	else {
		printf("writesettings failed due to unspecified CAN FD mode\n");
		return 1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_WRONLY|O_CREAT, S_IRUSR|S_IWUSR|S_IRGRP|S_IROTH);
	if (fd <= 0) {
		printf("unable to write setting file '%s'!\n", fname);
		return 1;
	}

	for (i = 0; i < idx ;i++) {
		sprintf(buf, "<%08X>%c.", sniftab[i].current.can_id, (is_set(i, ENABLE))?'1':'0');
		if (write(fd, buf, 12) < 0) {
			perror("write");
			return 1;
		}
		for (j = 0; j < max_dlen ; j++) {
			sprintf(buf, "%02X", sniftab[i].notch.data[j]);
			if (write(fd, buf, 2) < 0) {
				perror("write");
				return 1;
			}
		}
		if (write(fd, "\n", 1) < 0) {
			perror("write");
			return 1;
		}
		/* Classical CAN: 12 + 16  + 1 = 29  bytes per entry */
		/* CAN FD:        12 + 128 + 1 = 141 bytes per entry */
	}
	close(fd);
	return 0;
}